

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_mul(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io;
  LuaType LVar1;
  lua_Number lVar2;
  lua_Number lVar3;
  
  if (rb->tt_ == 3) {
    lVar2 = (rb->value_).n;
    LVar1 = rc->tt_;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_0014625b;
    LVar1 = rc->tt_;
    if (LVar1 == 0x13) {
      (ra->value_).i = (rb->value_).i * (rc->value_).i;
      ra->tt_ = 0x13;
      return;
    }
    lVar2 = (lua_Number)(rb->value_).i;
  }
  if (LVar1 == 0x13) {
    lVar3 = (lua_Number)(rc->value_).i;
  }
  else {
    if (LVar1 != 3) {
LAB_0014625b:
      luaT_trybinTM(L,rb,rc,ra,TM_MUL);
      return;
    }
    lVar3 = (rc->value_).n;
  }
  (ra->value_).n = lVar2 * lVar3;
  ra->tt_ = 3;
  return;
}

Assistant:

void raviV_op_mul(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Number nb;
  lua_Number nc;
  if (ttisinteger(rb) && ttisinteger(rc)) {
    lua_Integer ib = ivalue(rb);
    lua_Integer ic = ivalue(rc);
    setivalue(ra, intop(*, ib, ic));
  }
  else if (tonumberns(rb, nb) && tonumberns(rc, nc)) {
    setfltvalue(ra, luai_nummul(L, nb, nc));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_MUL);
  }
}